

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_pack8to4_int8.h
# Opt level: O0

void ncnn::convolution_pack8to4_int8_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_int8,int kernel_w,int kernel_h,
               int dilation_w,int dilation_h,int stride_w,int stride_h,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined4 uVar26;
  undefined6 uVar27;
  undefined8 uVar28;
  undefined4 uVar29;
  undefined6 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined4 uVar41;
  undefined6 uVar42;
  int in_ECX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  char cVar43;
  char cVar53;
  short sVar44;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  char cVar59;
  char cVar60;
  char cVar65;
  short sVar61;
  char cVar66;
  char cVar67;
  char cVar68;
  char cVar69;
  char cVar70;
  char cVar71;
  undefined1 auVar48 [16];
  short sVar45;
  short sVar62;
  undefined1 auVar49 [16];
  short sVar46;
  short sVar63;
  undefined1 auVar50 [16];
  short sVar47;
  short sVar64;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  char cVar72;
  char cVar73;
  char cVar74;
  char cVar75;
  char cVar76;
  char cVar77;
  char cVar78;
  char cVar79;
  char cVar80;
  char cVar81;
  char cVar82;
  char cVar83;
  char cVar84;
  char cVar85;
  char cVar86;
  char cVar87;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  __m128i _tmp3;
  __m128i _tmp2;
  __m128i _tmp1;
  __m128i _tmp0;
  __m128i _sh3;
  __m128i _sl3;
  __m128i _sh2;
  __m128i _sl2;
  __m128i _sh1;
  __m128i _sl1;
  __m128i _sh0;
  __m128i _sl0;
  __m128i _w3;
  __m128i _w2;
  __m128i _w1;
  __m128i _w0;
  __m128i _extw23;
  __m128i _extw01;
  __m128i _w23;
  __m128i _w01;
  __m128i _val;
  int k;
  char *sptr;
  Mat m_2;
  int q;
  char *kptr;
  __m128i _sum3;
  __m128i _sum2;
  __m128i _sum1;
  __m128i _sum0;
  int j_1;
  int i_1;
  int *outptr;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  int channels;
  int w;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  allocator_type *in_stack_fffffffffffff2d0;
  undefined2 in_stack_fffffffffffff2d8;
  undefined2 in_stack_fffffffffffff2da;
  undefined2 in_stack_fffffffffffff2dc;
  undefined2 in_stack_fffffffffffff2de;
  undefined2 in_stack_fffffffffffff2e0;
  undefined2 in_stack_fffffffffffff2e2;
  undefined2 in_stack_fffffffffffff2e4;
  undefined2 in_stack_fffffffffffff2e6;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_b38;
  undefined8 uStack_a30;
  int local_a24;
  undefined8 local_a18;
  undefined8 local_a10;
  undefined8 local_a08;
  undefined4 local_a00;
  long local_9f8;
  undefined4 local_9f0;
  undefined4 local_9ec;
  undefined4 local_9e8;
  undefined4 local_9e4;
  undefined4 local_9e0;
  undefined8 local_9d8;
  int local_9cc;
  undefined8 local_9c8;
  undefined8 local_9c0;
  undefined8 local_9b8;
  undefined4 local_9b0;
  long local_9a8;
  undefined4 local_9a0;
  undefined4 local_99c;
  undefined4 local_998;
  undefined4 local_994;
  undefined4 local_990;
  undefined8 local_988;
  long *local_980;
  undefined1 local_978 [12];
  int iStack_96c;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  int local_930;
  int local_92c;
  undefined8 local_928;
  undefined8 local_920;
  undefined8 local_918;
  undefined4 local_910;
  long local_908;
  undefined4 local_900;
  undefined4 local_8fc;
  undefined4 local_8f8;
  undefined4 local_8f4;
  undefined4 local_8f0;
  undefined8 local_8e8;
  long local_8e0;
  int local_8d8;
  int local_8d4;
  int local_8d0;
  int local_8cc;
  int local_8c8;
  int local_8c4;
  reference local_8c0;
  vector<int,_std::allocator<int>_> local_8a0;
  int local_884;
  int local_880;
  int local_87c;
  int local_878;
  int local_874;
  int local_870;
  int local_86c;
  int local_868;
  int local_864;
  long *local_860;
  long *local_858;
  long *local_850;
  undefined8 *local_848;
  undefined8 *local_840;
  undefined8 *local_838;
  undefined8 *local_810;
  undefined8 *local_800;
  undefined8 *local_7f0;
  undefined1 local_7e5;
  int local_7e4;
  undefined8 *local_7d8;
  undefined1 local_7b5;
  int local_7b4;
  undefined8 *local_7a8;
  undefined1 local_785;
  int local_784;
  undefined8 *local_778;
  long local_720;
  undefined4 local_714;
  long local_710;
  long *local_708;
  undefined4 local_6fc;
  int local_6f8;
  int local_6f4;
  undefined8 *local_6f0;
  long local_6e8;
  undefined4 local_6dc;
  long local_6d8;
  long local_6d0;
  undefined4 local_6c4;
  int local_6c0;
  int local_6bc;
  undefined8 *local_6b8;
  long local_6b0;
  undefined4 local_6a4;
  long local_6a0;
  long local_698;
  undefined4 local_68c;
  int local_688;
  int local_684;
  undefined8 *local_680;
  undefined4 local_674;
  long local_670;
  undefined4 local_664;
  long local_660;
  undefined4 local_654;
  long local_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  allocator_type *paStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 *local_4e0;
  long *local_4d8;
  long *local_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 *local_4b8;
  undefined8 *local_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  long local_3c8;
  long lStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  long local_3a8;
  long lStack_3a0;
  char local_398;
  char cStack_397;
  char cStack_396;
  char cStack_395;
  char cStack_394;
  char cStack_393;
  char cStack_392;
  char cStack_391;
  undefined1 uStack_390;
  undefined1 uStack_38f;
  undefined1 uStack_38e;
  undefined1 uStack_38d;
  undefined1 uStack_38c;
  undefined1 uStack_38b;
  undefined1 uStack_38a;
  undefined1 uStack_389;
  long local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  long local_368;
  long lStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  long local_348;
  long lStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  int iStack_270;
  int iStack_26c;
  undefined4 local_268;
  undefined4 uStack_264;
  int iStack_260;
  int iStack_25c;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  undefined4 local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  long local_238;
  undefined8 uStack_230;
  long *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  int local_194;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_870 = *(int *)((long)in_RDI + 0x2c);
  local_874 = (int)in_RDI[7];
  local_878 = *(int *)((long)in_RSI + 0x2c);
  local_87c = (int)in_RSI[6];
  local_880 = (int)in_RSI[7];
  local_884 = in_ECX * in_R8D;
  local_86c = in_R9D;
  local_868 = in_R8D;
  local_864 = in_ECX;
  local_860 = in_RDX;
  local_858 = in_RSI;
  local_850 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x2b4b6a);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT26(in_stack_fffffffffffff2e6,
                      CONCAT24(in_stack_fffffffffffff2e4,
                               CONCAT22(in_stack_fffffffffffff2e2,in_stack_fffffffffffff2e0))),
             CONCAT26(in_stack_fffffffffffff2de,
                      CONCAT24(in_stack_fffffffffffff2dc,
                               CONCAT22(in_stack_fffffffffffff2da,in_stack_fffffffffffff2d8))),
             in_stack_fffffffffffff2d0);
  std::allocator<int>::~allocator((allocator<int> *)0x2b4b96);
  local_8c0 = std::vector<int,_std::allocator<int>_>::operator[](&local_8a0,0);
  local_8c4 = 0;
  local_8c8 = 0;
  local_8cc = local_870 * in_stack_00000008 - local_864 * local_86c;
  for (local_8d0 = 0; local_8d0 < local_868; local_8d0 = local_8d0 + 1) {
    for (local_8d4 = 0; local_8d4 < local_864; local_8d4 = local_8d4 + 1) {
      local_8c0[local_8c4] = local_8c8;
      local_8c4 = local_8c4 + 1;
      local_8c8 = local_86c + local_8c8;
    }
    local_8c8 = local_8cc + local_8c8;
  }
  for (local_8d8 = 0; local_8d8 < local_880; local_8d8 = local_8d8 + 1) {
    local_7d8 = &local_928;
    local_684 = *(int *)((long)local_858 + 0x2c);
    local_688 = (int)local_858[6];
    local_68c = *(undefined4 *)((long)local_858 + 0x34);
    local_698 = *local_858 + local_858[8] * (long)local_8d8 * local_858[2];
    local_6a0 = local_858[2];
    local_6a4 = (undefined4)local_858[3];
    local_6b0 = local_858[4];
    local_680 = &local_928;
    local_670 = (long)local_684 * (long)local_688 * local_6a0;
    local_4b0 = &local_928;
    local_848 = &local_928;
    local_674 = 0x10;
    local_7e4 = local_8d8;
    local_7e5 = 1;
    local_928 = 0;
    local_918 = 0;
    local_910 = 0;
    local_900 = 0;
    local_8fc = 0;
    local_8f8 = 0;
    local_8f4 = 0;
    local_8f0 = 0;
    local_8e8 = 0;
    local_920 = 0;
    local_8e0 = local_698;
    for (local_92c = 0; local_92c < local_87c; local_92c = local_92c + 1) {
      for (local_930 = 0; local_930 < local_878; local_930 = local_930 + 1) {
        _local_978 = ZEXT816(0);
        local_778 = &local_9c8;
        local_6f4 = *(int *)((long)local_860 + 0x2c);
        local_6f8 = (int)local_860[6];
        local_6fc = *(undefined4 *)((long)local_860 + 0x34);
        local_708 = (long *)(*local_860 + local_860[8] * (long)local_8d8 * local_860[2]);
        local_710 = local_860[2];
        local_714 = (undefined4)local_860[3];
        local_720 = local_860[4];
        local_6f0 = &local_9c8;
        local_650 = (long)local_6f4 * (long)local_6f8 * local_710;
        local_4e0 = &local_9c8;
        local_840 = &local_9c8;
        uStack_440 = 0;
        local_448 = 0;
        uStack_450 = 0;
        local_458 = 0;
        uStack_460 = 0;
        local_468 = 0;
        uStack_470 = 0;
        local_478 = 0;
        local_654 = 0x10;
        local_784 = local_8d8;
        local_785 = 1;
        uStack_940 = 0;
        local_948 = 0;
        uStack_950 = 0;
        local_958 = 0;
        uStack_960 = 0;
        local_968 = 0;
        local_9c8 = 0;
        local_9b8 = 0;
        local_9b0 = 0;
        local_9a0 = 0;
        local_99c = 0;
        local_998 = 0;
        local_994 = 0;
        local_990 = 0;
        local_988 = 0;
        local_9c0 = 0;
        local_980 = local_708;
        for (local_9cc = 0; local_9cc < local_874; local_9cc = local_9cc + 1) {
          local_7a8 = &local_a18;
          local_6bc = *(int *)((long)local_850 + 0x2c);
          local_6c0 = (int)local_850[6];
          local_6c4 = *(undefined4 *)((long)local_850 + 0x34);
          local_6d0 = *local_850 + local_850[8] * (long)local_9cc * local_850[2];
          local_6d8 = local_850[2];
          local_6dc = (undefined4)local_850[3];
          local_6e8 = local_850[4];
          local_6b8 = &local_a18;
          local_660 = (long)local_6bc * (long)local_6c0 * local_6d8;
          local_194 = local_92c * in_stack_00000018;
          local_190 = &local_a18;
          for (local_a24 = 0; local_a24 < local_884; local_a24 = local_a24 + 1) {
            local_220 = (long *)(local_6d0 + (long)local_6bc * (long)local_194 * local_6d8 +
                                 (long)(local_930 * in_stack_00000010 * 8) +
                                (long)(local_8c0[local_a24] << 3));
            local_388 = *local_220;
            uStack_230 = 0;
            uStack_380 = 0;
            local_488 = 0;
            uStack_480 = 0;
            local_3e8 = 0;
            uStack_3e0 = 0;
            uStack_3f0 = 0;
            local_3f8._0_1_ = (char)local_388;
            local_3f8._1_1_ = (char)((ulong)local_388 >> 8);
            local_3f8._2_1_ = (char)((ulong)local_388 >> 0x10);
            local_3f8._3_1_ = (char)((ulong)local_388 >> 0x18);
            local_3f8._4_1_ = (char)((ulong)local_388 >> 0x20);
            local_3f8._5_1_ = (char)((ulong)local_388 >> 0x28);
            local_3f8._6_1_ = (char)((ulong)local_388 >> 0x30);
            local_3f8._7_1_ = (undefined1)((ulong)local_388 >> 0x38);
            local_398 = -((char)local_3f8 < '\0');
            cStack_397 = -(local_3f8._1_1_ < '\0');
            cStack_396 = -(local_3f8._2_1_ < '\0');
            cStack_395 = -(local_3f8._3_1_ < '\0');
            cStack_394 = -(local_3f8._4_1_ < '\0');
            cStack_393 = -(local_3f8._5_1_ < '\0');
            cStack_392 = -(local_3f8._6_1_ < '\0');
            cStack_391 = -(local_388 < 0);
            uStack_390 = 0;
            uStack_38f = 0;
            uStack_38e = 0;
            uStack_38d = 0;
            uStack_38c = 0;
            uStack_38b = 0;
            uStack_38a = 0;
            uStack_389 = 0;
            sVar47 = CONCAT11(local_398,(char)local_3f8);
            uVar41 = CONCAT13(cStack_397,CONCAT12(local_3f8._1_1_,sVar47));
            uVar42 = CONCAT15(cStack_396,CONCAT14(local_3f8._2_1_,uVar41));
            local_208 = CONCAT17(cStack_395,CONCAT16(local_3f8._3_1_,uVar42));
            uStack_a30._0_2_ = CONCAT11(cStack_394,local_3f8._4_1_);
            uStack_a30._0_4_ = CONCAT13(cStack_393,CONCAT12(local_3f8._5_1_,(short)uStack_a30));
            uStack_a30._0_6_ = CONCAT15(cStack_392,CONCAT14(local_3f8._6_1_,(undefined4)uStack_a30))
            ;
            uStack_a30 = CONCAT17(cStack_391,CONCAT16(local_3f8._7_1_,(undefined6)uStack_a30));
            local_4d0 = local_980;
            local_3a8 = *local_980;
            lStack_3a0 = local_980[1];
            local_4d8 = local_980 + 2;
            local_3c8 = *local_4d8;
            lStack_3c0 = local_980[3];
            local_498 = 0;
            uStack_490 = 0;
            local_408 = 0;
            uStack_400 = 0;
            local_418._0_1_ = (char)local_3a8;
            local_418._1_1_ = (char)((ulong)local_3a8 >> 8);
            local_418._2_1_ = (char)((ulong)local_3a8 >> 0x10);
            local_418._3_1_ = (char)((ulong)local_3a8 >> 0x18);
            local_418._4_1_ = (char)((ulong)local_3a8 >> 0x20);
            local_418._5_1_ = (char)((ulong)local_3a8 >> 0x28);
            local_418._6_1_ = (char)((ulong)local_3a8 >> 0x30);
            local_418._7_1_ = (undefined1)((ulong)local_3a8 >> 0x38);
            uStack_410._0_1_ = (char)lStack_3a0;
            uStack_410._1_1_ = (char)((ulong)lStack_3a0 >> 8);
            uStack_410._2_1_ = (char)((ulong)lStack_3a0 >> 0x10);
            uStack_410._3_1_ = (char)((ulong)lStack_3a0 >> 0x18);
            uStack_410._4_1_ = (char)((ulong)lStack_3a0 >> 0x20);
            uStack_410._5_1_ = (char)((ulong)lStack_3a0 >> 0x28);
            uStack_410._6_1_ = (char)((ulong)lStack_3a0 >> 0x30);
            uStack_410._7_1_ = (undefined1)((ulong)lStack_3a0 >> 0x38);
            cVar72 = -((char)local_418 < '\0');
            cVar73 = -(local_418._1_1_ < '\0');
            cVar74 = -(local_418._2_1_ < '\0');
            cVar75 = -(local_418._3_1_ < '\0');
            cVar76 = -(local_418._4_1_ < '\0');
            cVar77 = -(local_418._5_1_ < '\0');
            cVar78 = -(local_418._6_1_ < '\0');
            cVar79 = -(local_3a8 < 0);
            cVar80 = -((char)uStack_410 < '\0');
            cVar81 = -(uStack_410._1_1_ < '\0');
            cVar82 = -(uStack_410._2_1_ < '\0');
            cVar83 = -(uStack_410._3_1_ < '\0');
            cVar84 = -(uStack_410._4_1_ < '\0');
            cVar85 = -(uStack_410._5_1_ < '\0');
            cVar86 = -(uStack_410._6_1_ < '\0');
            cVar87 = -(lStack_3a0 < 0);
            local_4a8 = 0;
            uStack_4a0 = 0;
            local_428 = 0;
            uStack_420 = 0;
            local_438._0_1_ = (char)local_3c8;
            local_438._1_1_ = (char)((ulong)local_3c8 >> 8);
            local_438._2_1_ = (char)((ulong)local_3c8 >> 0x10);
            local_438._3_1_ = (char)((ulong)local_3c8 >> 0x18);
            local_438._4_1_ = (char)((ulong)local_3c8 >> 0x20);
            local_438._5_1_ = (char)((ulong)local_3c8 >> 0x28);
            local_438._6_1_ = (char)((ulong)local_3c8 >> 0x30);
            local_438._7_1_ = (undefined1)((ulong)local_3c8 >> 0x38);
            uStack_430._0_1_ = (char)lStack_3c0;
            uStack_430._1_1_ = (char)((ulong)lStack_3c0 >> 8);
            uStack_430._2_1_ = (char)((ulong)lStack_3c0 >> 0x10);
            uStack_430._3_1_ = (char)((ulong)lStack_3c0 >> 0x18);
            uStack_430._4_1_ = (char)((ulong)lStack_3c0 >> 0x20);
            uStack_430._5_1_ = (char)((ulong)lStack_3c0 >> 0x28);
            uStack_430._6_1_ = (char)((ulong)lStack_3c0 >> 0x30);
            uStack_430._7_1_ = (undefined1)((ulong)lStack_3c0 >> 0x38);
            cVar43 = -((char)local_438 < '\0');
            cVar53 = -(local_438._1_1_ < '\0');
            cVar54 = -(local_438._2_1_ < '\0');
            cVar55 = -(local_438._3_1_ < '\0');
            cVar56 = -(local_438._4_1_ < '\0');
            cVar57 = -(local_438._5_1_ < '\0');
            cVar58 = -(local_438._6_1_ < '\0');
            cVar59 = -(local_3c8 < 0);
            cVar60 = -((char)uStack_430 < '\0');
            cVar65 = -(uStack_430._1_1_ < '\0');
            cVar66 = -(uStack_430._2_1_ < '\0');
            cVar67 = -(uStack_430._3_1_ < '\0');
            cVar68 = -(uStack_430._4_1_ < '\0');
            cVar69 = -(uStack_430._5_1_ < '\0');
            cVar70 = -(uStack_430._6_1_ < '\0');
            cVar71 = -(lStack_3c0 < 0);
            local_3b8 = CONCAT17(cVar79,CONCAT16(cVar78,CONCAT15(cVar77,CONCAT14(cVar76,CONCAT13(
                                                  cVar75,CONCAT12(cVar74,CONCAT11(cVar73,cVar72)))))
                                                ));
            uStack_3b0 = CONCAT17(cVar87,CONCAT16(cVar86,CONCAT15(cVar85,CONCAT14(cVar84,CONCAT13(
                                                  cVar83,CONCAT12(cVar82,CONCAT11(cVar81,cVar80)))))
                                                 ));
            local_358 = CONCAT17(cVar79,CONCAT16(cVar78,CONCAT15(cVar77,CONCAT14(cVar76,CONCAT13(
                                                  cVar75,CONCAT12(cVar74,CONCAT11(cVar73,cVar72)))))
                                                ));
            uStack_350 = CONCAT17(cVar87,CONCAT16(cVar86,CONCAT15(cVar85,CONCAT14(cVar84,CONCAT13(
                                                  cVar83,CONCAT12(cVar82,CONCAT11(cVar81,cVar80)))))
                                                 ));
            local_3d8 = CONCAT17(cVar59,CONCAT16(cVar58,CONCAT15(cVar57,CONCAT14(cVar56,CONCAT13(
                                                  cVar55,CONCAT12(cVar54,CONCAT11(cVar53,cVar43)))))
                                                ));
            uStack_3d0 = CONCAT17(cVar71,CONCAT16(cVar70,CONCAT15(cVar69,CONCAT14(cVar68,CONCAT13(
                                                  cVar67,CONCAT12(cVar66,CONCAT11(cVar65,cVar60)))))
                                                 ));
            local_378 = CONCAT17(cVar59,CONCAT16(cVar58,CONCAT15(cVar57,CONCAT14(cVar56,CONCAT13(
                                                  cVar55,CONCAT12(cVar54,CONCAT11(cVar53,cVar43)))))
                                                ));
            uStack_370 = CONCAT17(cVar71,CONCAT16(cVar70,CONCAT15(cVar69,CONCAT14(cVar68,CONCAT13(
                                                  cVar67,CONCAT12(cVar66,CONCAT11(cVar65,cVar60)))))
                                                 ));
            uVar26 = CONCAT13(cVar73,CONCAT12(local_418._1_1_,CONCAT11(cVar72,(char)local_418)));
            uVar27 = CONCAT15(cVar74,CONCAT14(local_418._2_1_,uVar26));
            uVar35 = CONCAT17(cVar75,CONCAT16(local_418._3_1_,uVar27));
            uVar29 = CONCAT13(cVar77,CONCAT12(local_418._5_1_,CONCAT11(cVar76,local_418._4_1_)));
            uVar30 = CONCAT15(cVar78,CONCAT14(local_418._6_1_,uVar29));
            uVar36 = CONCAT17(cVar79,CONCAT16(local_418._7_1_,uVar30));
            local_1a8._2_2_ = (short)((uint)uVar41 >> 0x10);
            local_1a8._4_2_ = (short)((uint6)uVar42 >> 0x20);
            local_1a8._6_2_ = (short)((ulong)local_208 >> 0x30);
            uStack_1a0._2_2_ = (short)((uint)(undefined4)uStack_a30 >> 0x10);
            uStack_1a0._4_2_ = (short)((uint6)(undefined6)uStack_a30 >> 0x20);
            uStack_1a0._6_2_ = (short)((ulong)uStack_a30 >> 0x30);
            local_1b8._2_2_ = (short)((uint)uVar26 >> 0x10);
            local_1b8._4_2_ = (short)((uint6)uVar27 >> 0x20);
            local_1b8._6_2_ = (short)((ulong)uVar35 >> 0x30);
            uStack_1b0._2_2_ = (short)((uint)uVar29 >> 0x10);
            uStack_1b0._4_2_ = (short)((uint6)uVar30 >> 0x20);
            uStack_1b0._6_2_ = (short)((ulong)uVar36 >> 0x30);
            sVar44 = sVar47 * CONCAT11(cVar72,(char)local_418);
            local_1b8._2_2_ = local_1a8._2_2_ * local_1b8._2_2_;
            local_1b8._4_2_ = local_1a8._4_2_ * local_1b8._4_2_;
            local_1b8._6_2_ = local_1a8._6_2_ * local_1b8._6_2_;
            sVar61 = (short)uStack_a30 * CONCAT11(cVar76,local_418._4_1_);
            uStack_1b0._2_2_ = uStack_1a0._2_2_ * uStack_1b0._2_2_;
            uStack_1b0._4_2_ = uStack_1a0._4_2_ * uStack_1b0._4_2_;
            uStack_1b0._6_2_ = uStack_1a0._6_2_ * uStack_1b0._6_2_;
            uStack_110 = uStack_a30;
            local_128 = CONCAT17(cVar75,CONCAT16(local_418._3_1_,
                                                 CONCAT15(cVar74,CONCAT14(local_418._2_1_,
                                                                          CONCAT13(cVar73,CONCAT12(
                                                  local_418._1_1_,CONCAT11(cVar72,(char)local_418)))
                                                  ))));
            uStack_120 = CONCAT17(cVar79,CONCAT16(local_418._7_1_,
                                                  CONCAT15(cVar78,CONCAT14(local_418._6_1_,
                                                                           CONCAT13(cVar77,CONCAT12(
                                                  local_418._5_1_,CONCAT11(cVar76,local_418._4_1_)))
                                                  ))));
            auVar40._8_8_ = uStack_a30;
            auVar40._0_8_ = local_208;
            auVar48._8_8_ = uStack_120;
            auVar48._0_8_ = local_128;
            auVar48 = pmulhw(auVar40,auVar48);
            local_c08 = auVar48._0_8_;
            uStack_c00 = auVar48._8_8_;
            uStack_1c0 = uStack_a30;
            uVar26 = CONCAT13(cVar81,CONCAT12(uStack_410._1_1_,CONCAT11(cVar80,(char)uStack_410)));
            uVar27 = CONCAT15(cVar82,CONCAT14(uStack_410._2_1_,uVar26));
            uVar33 = CONCAT17(cVar83,CONCAT16(uStack_410._3_1_,uVar27));
            uVar29 = CONCAT13(cVar85,CONCAT12(uStack_410._5_1_,CONCAT11(cVar84,uStack_410._4_1_)));
            uVar30 = CONCAT15(cVar86,CONCAT14(uStack_410._6_1_,uVar29));
            uVar34 = CONCAT17(cVar87,CONCAT16(uStack_410._7_1_,uVar30));
            local_1d8._2_2_ = (short)((uint)uVar26 >> 0x10);
            local_1d8._4_2_ = (short)((uint6)uVar27 >> 0x20);
            local_1d8._6_2_ = (short)((ulong)uVar33 >> 0x30);
            uStack_1d0._2_2_ = (short)((uint)uVar29 >> 0x10);
            uStack_1d0._4_2_ = (short)((uint6)uVar30 >> 0x20);
            uStack_1d0._6_2_ = (short)((ulong)uVar34 >> 0x30);
            sVar45 = sVar47 * CONCAT11(cVar80,(char)uStack_410);
            local_1d8._2_2_ = local_1a8._2_2_ * local_1d8._2_2_;
            local_1d8._4_2_ = local_1a8._4_2_ * local_1d8._4_2_;
            local_1d8._6_2_ = local_1a8._6_2_ * local_1d8._6_2_;
            sVar62 = (short)uStack_a30 * CONCAT11(cVar84,uStack_410._4_1_);
            uStack_1d0._2_2_ = uStack_1a0._2_2_ * uStack_1d0._2_2_;
            uStack_1d0._4_2_ = uStack_1a0._4_2_ * uStack_1d0._4_2_;
            uStack_1d0._6_2_ = uStack_1a0._6_2_ * uStack_1d0._6_2_;
            uStack_130 = uStack_a30;
            local_148 = CONCAT17(cVar83,CONCAT16(uStack_410._3_1_,
                                                 CONCAT15(cVar82,CONCAT14(uStack_410._2_1_,
                                                                          CONCAT13(cVar81,CONCAT12(
                                                  uStack_410._1_1_,CONCAT11(cVar80,(char)uStack_410)
                                                  ))))));
            uStack_140 = CONCAT17(cVar87,CONCAT16(uStack_410._7_1_,
                                                  CONCAT15(cVar86,CONCAT14(uStack_410._6_1_,
                                                                           CONCAT13(cVar85,CONCAT12(
                                                  uStack_410._5_1_,CONCAT11(cVar84,uStack_410._4_1_)
                                                  ))))));
            auVar39._8_8_ = uStack_a30;
            auVar39._0_8_ = local_208;
            auVar49._8_8_ = uStack_140;
            auVar49._0_8_ = local_148;
            auVar49 = pmulhw(auVar39,auVar49);
            local_c18 = auVar49._0_8_;
            uStack_c10 = auVar49._8_8_;
            uStack_1e0 = uStack_a30;
            uVar26 = CONCAT13(cVar53,CONCAT12(local_438._1_1_,CONCAT11(cVar43,(char)local_438)));
            uVar27 = CONCAT15(cVar54,CONCAT14(local_438._2_1_,uVar26));
            uVar31 = CONCAT17(cVar55,CONCAT16(local_438._3_1_,uVar27));
            uVar29 = CONCAT13(cVar57,CONCAT12(local_438._5_1_,CONCAT11(cVar56,local_438._4_1_)));
            uVar30 = CONCAT15(cVar58,CONCAT14(local_438._6_1_,uVar29));
            uVar32 = CONCAT17(cVar59,CONCAT16(local_438._7_1_,uVar30));
            local_1f8._2_2_ = (short)((uint)uVar26 >> 0x10);
            local_1f8._4_2_ = (short)((uint6)uVar27 >> 0x20);
            local_1f8._6_2_ = (short)((ulong)uVar31 >> 0x30);
            uStack_1f0._2_2_ = (short)((uint)uVar29 >> 0x10);
            uStack_1f0._4_2_ = (short)((uint6)uVar30 >> 0x20);
            uStack_1f0._6_2_ = (short)((ulong)uVar32 >> 0x30);
            sVar46 = sVar47 * CONCAT11(cVar43,(char)local_438);
            local_1f8._2_2_ = local_1a8._2_2_ * local_1f8._2_2_;
            local_1f8._4_2_ = local_1a8._4_2_ * local_1f8._4_2_;
            local_1f8._6_2_ = local_1a8._6_2_ * local_1f8._6_2_;
            sVar63 = (short)uStack_a30 * CONCAT11(cVar56,local_438._4_1_);
            uStack_1f0._2_2_ = uStack_1a0._2_2_ * uStack_1f0._2_2_;
            uStack_1f0._4_2_ = uStack_1a0._4_2_ * uStack_1f0._4_2_;
            uStack_1f0._6_2_ = uStack_1a0._6_2_ * uStack_1f0._6_2_;
            uStack_150 = uStack_a30;
            local_168 = CONCAT17(cVar55,CONCAT16(local_438._3_1_,
                                                 CONCAT15(cVar54,CONCAT14(local_438._2_1_,
                                                                          CONCAT13(cVar53,CONCAT12(
                                                  local_438._1_1_,CONCAT11(cVar43,(char)local_438)))
                                                  ))));
            uStack_160 = CONCAT17(cVar59,CONCAT16(local_438._7_1_,
                                                  CONCAT15(cVar58,CONCAT14(local_438._6_1_,
                                                                           CONCAT13(cVar57,CONCAT12(
                                                  local_438._5_1_,CONCAT11(cVar56,local_438._4_1_)))
                                                  ))));
            auVar38._8_8_ = uStack_a30;
            auVar38._0_8_ = local_208;
            auVar50._8_8_ = uStack_160;
            auVar50._0_8_ = local_168;
            auVar50 = pmulhw(auVar38,auVar50);
            local_c28 = auVar50._0_8_;
            uStack_c20 = auVar50._8_8_;
            uStack_200 = uStack_a30;
            uVar26 = CONCAT13(cVar65,CONCAT12(uStack_430._1_1_,CONCAT11(cVar60,(char)uStack_430)));
            uVar27 = CONCAT15(cVar66,CONCAT14(uStack_430._2_1_,uVar26));
            uVar25 = CONCAT17(cVar67,CONCAT16(uStack_430._3_1_,uVar27));
            uVar29 = CONCAT13(cVar69,CONCAT12(uStack_430._5_1_,CONCAT11(cVar68,uStack_430._4_1_)));
            uVar30 = CONCAT15(cVar70,CONCAT14(uStack_430._6_1_,uVar29));
            uVar28 = CONCAT17(cVar71,CONCAT16(uStack_430._7_1_,uVar30));
            local_218._2_2_ = (short)((uint)uVar26 >> 0x10);
            local_218._4_2_ = (short)((uint6)uVar27 >> 0x20);
            local_218._6_2_ = (short)((ulong)uVar25 >> 0x30);
            uStack_210._2_2_ = (short)((uint)uVar29 >> 0x10);
            uStack_210._4_2_ = (short)((uint6)uVar30 >> 0x20);
            uStack_210._6_2_ = (short)((ulong)uVar28 >> 0x30);
            sVar47 = sVar47 * CONCAT11(cVar60,(char)uStack_430);
            local_1a8._2_2_ = local_1a8._2_2_ * local_218._2_2_;
            local_1a8._4_2_ = local_1a8._4_2_ * local_218._4_2_;
            local_1a8._6_2_ = local_1a8._6_2_ * local_218._6_2_;
            sVar64 = (short)uStack_a30 * CONCAT11(cVar68,uStack_430._4_1_);
            uStack_1a0._2_2_ = uStack_1a0._2_2_ * uStack_210._2_2_;
            uStack_1a0._4_2_ = uStack_1a0._4_2_ * uStack_210._4_2_;
            uStack_1a0._6_2_ = uStack_1a0._6_2_ * uStack_210._6_2_;
            uStack_170 = uStack_a30;
            local_188 = CONCAT17(cVar67,CONCAT16(uStack_430._3_1_,
                                                 CONCAT15(cVar66,CONCAT14(uStack_430._2_1_,
                                                                          CONCAT13(cVar65,CONCAT12(
                                                  uStack_430._1_1_,CONCAT11(cVar60,(char)uStack_430)
                                                  ))))));
            uStack_180 = CONCAT17(cVar71,CONCAT16(uStack_430._7_1_,
                                                  CONCAT15(cVar70,CONCAT14(uStack_430._6_1_,
                                                                           CONCAT13(cVar69,CONCAT12(
                                                  uStack_430._5_1_,CONCAT11(cVar68,uStack_430._4_1_)
                                                  ))))));
            auVar37._8_8_ = uStack_a30;
            auVar37._0_8_ = local_208;
            auVar51._8_8_ = uStack_180;
            auVar51._0_8_ = local_188;
            auVar51 = pmulhw(auVar37,auVar51);
            local_c38 = auVar51._0_8_;
            local_b38 = local_c38;
            uStack_c30 = auVar51._8_8_;
            local_98 = CONCAT26(local_1b8._6_2_,
                                CONCAT24(local_1b8._4_2_,CONCAT22(local_1b8._2_2_,sVar44)));
            uStack_90 = CONCAT26(uStack_1b0._6_2_,
                                 CONCAT24(uStack_1b0._4_2_,CONCAT22(uStack_1b0._2_2_,sVar61)));
            uStack_a0 = uStack_c00;
            local_a8._0_2_ = auVar48._0_2_;
            local_a8._2_2_ = auVar48._2_2_;
            local_a8._4_2_ = auVar48._4_2_;
            local_a8._6_2_ = auVar48._6_2_;
            uVar23 = CONCAT26(local_a8._2_2_,
                              CONCAT24(local_1b8._2_2_,CONCAT22((undefined2)local_a8,sVar44)));
            uVar24 = CONCAT26(local_a8._6_2_,
                              CONCAT24(local_1b8._6_2_,CONCAT22(local_a8._4_2_,local_1b8._4_2_)));
            uVar1 = local_948;
            uVar2 = uStack_940;
            local_4f8._0_4_ = (int)local_948;
            local_4f8._4_4_ = (int)((ulong)local_948 >> 0x20);
            uStack_4f0._0_4_ = (int)uStack_940;
            uStack_4f0._4_4_ = (int)((ulong)uStack_940 >> 0x20);
            local_508._4_4_ = (int)((ulong)uVar23 >> 0x20);
            uStack_500._4_4_ = (int)((ulong)uVar24 >> 0x20);
            local_4f8._0_4_ = (int)local_4f8 + CONCAT22((undefined2)local_a8,sVar44);
            uStack_4f0._0_4_ = (int)uStack_4f0 + CONCAT22(local_a8._4_2_,local_1b8._4_2_);
            local_948 = CONCAT44(local_4f8._4_4_ + local_508._4_4_,(int)local_4f8);
            uStack_940 = CONCAT44(uStack_4f0._4_4_ + uStack_500._4_4_,(int)uStack_4f0);
            local_b8 = CONCAT26(local_1d8._6_2_,
                                CONCAT24(local_1d8._4_2_,CONCAT22(local_1d8._2_2_,sVar45)));
            uStack_b0 = CONCAT26(uStack_1d0._6_2_,
                                 CONCAT24(uStack_1d0._4_2_,CONCAT22(uStack_1d0._2_2_,sVar62)));
            uStack_c0 = uStack_c10;
            local_c8._0_2_ = auVar49._0_2_;
            local_c8._2_2_ = auVar49._2_2_;
            local_c8._4_2_ = auVar49._4_2_;
            local_c8._6_2_ = auVar49._6_2_;
            uVar21 = CONCAT26(local_c8._2_2_,
                              CONCAT24(local_1d8._2_2_,CONCAT22((undefined2)local_c8,sVar45)));
            uVar22 = CONCAT26(local_c8._6_2_,
                              CONCAT24(local_1d8._6_2_,CONCAT22(local_c8._4_2_,local_1d8._4_2_)));
            uVar3 = local_958;
            uVar4 = uStack_950;
            local_518._0_4_ = (int)local_958;
            local_518._4_4_ = (int)((ulong)local_958 >> 0x20);
            uStack_510._0_4_ = (int)uStack_950;
            uStack_510._4_4_ = (int)((ulong)uStack_950 >> 0x20);
            local_528._4_4_ = (int)((ulong)uVar21 >> 0x20);
            uStack_520._4_4_ = (int)((ulong)uVar22 >> 0x20);
            local_518._0_4_ = (int)local_518 + CONCAT22((undefined2)local_c8,sVar45);
            uStack_510._0_4_ = (int)uStack_510 + CONCAT22(local_c8._4_2_,local_1d8._4_2_);
            local_958 = CONCAT44(local_518._4_4_ + local_528._4_4_,(int)local_518);
            uStack_950 = CONCAT44(uStack_510._4_4_ + uStack_520._4_4_,(int)uStack_510);
            local_d8 = CONCAT26(local_1f8._6_2_,
                                CONCAT24(local_1f8._4_2_,CONCAT22(local_1f8._2_2_,sVar46)));
            uStack_d0 = CONCAT26(uStack_1f0._6_2_,
                                 CONCAT24(uStack_1f0._4_2_,CONCAT22(uStack_1f0._2_2_,sVar63)));
            uStack_e0 = uStack_c20;
            local_e8._0_2_ = auVar50._0_2_;
            local_e8._2_2_ = auVar50._2_2_;
            local_e8._4_2_ = auVar50._4_2_;
            local_e8._6_2_ = auVar50._6_2_;
            uVar19 = CONCAT26(local_e8._2_2_,
                              CONCAT24(local_1f8._2_2_,CONCAT22((undefined2)local_e8,sVar46)));
            uVar20 = CONCAT26(local_e8._6_2_,
                              CONCAT24(local_1f8._6_2_,CONCAT22(local_e8._4_2_,local_1f8._4_2_)));
            uVar5 = local_968;
            uVar6 = uStack_960;
            local_538._0_4_ = (int)local_968;
            local_538._4_4_ = (int)((ulong)local_968 >> 0x20);
            uStack_530._0_4_ = (int)uStack_960;
            uStack_530._4_4_ = (int)((ulong)uStack_960 >> 0x20);
            local_548._4_4_ = (int)((ulong)uVar19 >> 0x20);
            uStack_540._4_4_ = (int)((ulong)uVar20 >> 0x20);
            local_538._0_4_ = (int)local_538 + CONCAT22((undefined2)local_e8,sVar46);
            uStack_530._0_4_ = (int)uStack_530 + CONCAT22(local_e8._4_2_,local_1f8._4_2_);
            local_968 = CONCAT44(local_538._4_4_ + local_548._4_4_,(int)local_538);
            uStack_960 = CONCAT44(uStack_530._4_4_ + uStack_540._4_4_,(int)uStack_530);
            local_f8 = CONCAT26(local_1a8._6_2_,
                                CONCAT24(local_1a8._4_2_,CONCAT22(local_1a8._2_2_,sVar47)));
            uStack_f0 = CONCAT26(uStack_1a0._6_2_,
                                 CONCAT24(uStack_1a0._4_2_,CONCAT22(uStack_1a0._2_2_,sVar64)));
            uStack_100 = uStack_c30;
            local_108._0_2_ = auVar51._0_2_;
            local_108._2_2_ = auVar51._2_2_;
            local_108._4_2_ = auVar51._4_2_;
            local_108._6_2_ = auVar51._6_2_;
            uVar17 = CONCAT26(local_108._2_2_,
                              CONCAT24(local_1a8._2_2_,CONCAT22((undefined2)local_108,sVar47)));
            uVar18 = CONCAT26(local_108._6_2_,
                              CONCAT24(local_1a8._6_2_,CONCAT22(local_108._4_2_,local_1a8._4_2_)));
            uVar7 = local_978._0_8_;
            uVar8 = stack0xfffffffffffff690;
            local_558._0_4_ = local_978._0_4_;
            local_558._4_4_ = local_978._4_4_;
            uStack_550._0_4_ = local_978._8_4_;
            uStack_550._4_4_ = local_978._12_4_;
            local_568._4_4_ = (int)((ulong)uVar17 >> 0x20);
            uStack_560._4_4_ = (int)((ulong)uVar18 >> 0x20);
            local_978._0_4_ = (int)local_558 + CONCAT22((undefined2)local_108,sVar47);
            uStack_550._0_4_ = (int)uStack_550 + CONCAT22(local_108._4_2_,local_1a8._4_2_);
            local_978._4_4_ = local_558._4_4_ + local_568._4_4_;
            local_978._8_4_ = (int)uStack_550;
            iStack_96c = uStack_550._4_4_ + uStack_560._4_4_;
            local_18 = CONCAT26(local_1b8._6_2_,
                                CONCAT24(local_1b8._4_2_,CONCAT22(local_1b8._2_2_,sVar44)));
            uStack_10 = CONCAT26(uStack_1b0._6_2_,
                                 CONCAT24(uStack_1b0._4_2_,CONCAT22(uStack_1b0._2_2_,sVar61)));
            local_28 = local_c08;
            uStack_20._0_2_ = auVar48._8_2_;
            uStack_20._2_2_ = auVar48._10_2_;
            uStack_20._4_2_ = auVar48._12_2_;
            uStack_20._6_2_ = auVar48._14_2_;
            uVar15 = CONCAT26(uStack_20._2_2_,
                              CONCAT24(uStack_1b0._2_2_,CONCAT22((undefined2)uStack_20,sVar61)));
            uVar16 = CONCAT26(uStack_20._6_2_,
                              CONCAT24(uStack_1b0._6_2_,CONCAT22(uStack_20._4_2_,uStack_1b0._4_2_)))
            ;
            local_578 = local_948;
            uStack_570 = uStack_940;
            local_588._4_4_ = (int)((ulong)uVar15 >> 0x20);
            uStack_580._4_4_ = (int)((ulong)uVar16 >> 0x20);
            local_948 = CONCAT44(local_4f8._4_4_ + local_508._4_4_ + local_588._4_4_,
                                 (int)local_4f8 + CONCAT22((undefined2)uStack_20,sVar61));
            uStack_940 = CONCAT44(uStack_4f0._4_4_ + uStack_500._4_4_ + uStack_580._4_4_,
                                  (int)uStack_4f0 + CONCAT22(uStack_20._4_2_,uStack_1b0._4_2_));
            local_38 = CONCAT26(local_1d8._6_2_,
                                CONCAT24(local_1d8._4_2_,CONCAT22(local_1d8._2_2_,sVar45)));
            uStack_30 = CONCAT26(uStack_1d0._6_2_,
                                 CONCAT24(uStack_1d0._4_2_,CONCAT22(uStack_1d0._2_2_,sVar62)));
            local_48 = local_c18;
            uStack_40._0_2_ = auVar49._8_2_;
            uStack_40._2_2_ = auVar49._10_2_;
            uStack_40._4_2_ = auVar49._12_2_;
            uStack_40._6_2_ = auVar49._14_2_;
            uVar13 = CONCAT26(uStack_40._2_2_,
                              CONCAT24(uStack_1d0._2_2_,CONCAT22((undefined2)uStack_40,sVar62)));
            uVar14 = CONCAT26(uStack_40._6_2_,
                              CONCAT24(uStack_1d0._6_2_,CONCAT22(uStack_40._4_2_,uStack_1d0._4_2_)))
            ;
            local_598 = local_958;
            uStack_590 = uStack_950;
            local_5a8._4_4_ = (int)((ulong)uVar13 >> 0x20);
            uStack_5a0._4_4_ = (int)((ulong)uVar14 >> 0x20);
            local_958 = CONCAT44(local_518._4_4_ + local_528._4_4_ + local_5a8._4_4_,
                                 (int)local_518 + CONCAT22((undefined2)uStack_40,sVar62));
            uStack_950 = CONCAT44(uStack_510._4_4_ + uStack_520._4_4_ + uStack_5a0._4_4_,
                                  (int)uStack_510 + CONCAT22(uStack_40._4_2_,uStack_1d0._4_2_));
            local_58 = CONCAT26(local_1f8._6_2_,
                                CONCAT24(local_1f8._4_2_,CONCAT22(local_1f8._2_2_,sVar46)));
            uStack_50 = CONCAT26(uStack_1f0._6_2_,
                                 CONCAT24(uStack_1f0._4_2_,CONCAT22(uStack_1f0._2_2_,sVar63)));
            local_68 = local_c28;
            uStack_60._0_2_ = auVar50._8_2_;
            uStack_60._2_2_ = auVar50._10_2_;
            uStack_60._4_2_ = auVar50._12_2_;
            uStack_60._6_2_ = auVar50._14_2_;
            uVar11 = CONCAT26(uStack_60._2_2_,
                              CONCAT24(uStack_1f0._2_2_,CONCAT22((undefined2)uStack_60,sVar63)));
            uVar12 = CONCAT26(uStack_60._6_2_,
                              CONCAT24(uStack_1f0._6_2_,CONCAT22(uStack_60._4_2_,uStack_1f0._4_2_)))
            ;
            local_5b8 = local_968;
            uStack_5b0 = uStack_960;
            local_5c8._4_4_ = (int)((ulong)uVar11 >> 0x20);
            uStack_5c0._4_4_ = (int)((ulong)uVar12 >> 0x20);
            local_968 = CONCAT44(local_538._4_4_ + local_548._4_4_ + local_5c8._4_4_,
                                 (int)local_538 + CONCAT22((undefined2)uStack_60,sVar63));
            uStack_960 = CONCAT44(uStack_530._4_4_ + uStack_540._4_4_ + uStack_5c0._4_4_,
                                  (int)uStack_530 + CONCAT22(uStack_60._4_2_,uStack_1f0._4_2_));
            local_78 = CONCAT26(local_1a8._6_2_,
                                CONCAT24(local_1a8._4_2_,CONCAT22(local_1a8._2_2_,sVar47)));
            uStack_70 = CONCAT26(uStack_1a0._6_2_,
                                 CONCAT24(uStack_1a0._4_2_,CONCAT22(uStack_1a0._2_2_,sVar64)));
            local_88 = local_c38;
            uStack_80._0_2_ = auVar51._8_2_;
            uStack_80._2_2_ = auVar51._10_2_;
            uStack_80._4_2_ = auVar51._12_2_;
            uStack_80._6_2_ = auVar51._14_2_;
            uVar9 = CONCAT26(uStack_80._2_2_,
                             CONCAT24(uStack_1a0._2_2_,CONCAT22((undefined2)uStack_80,sVar64)));
            uVar10 = CONCAT26(uStack_80._6_2_,
                              CONCAT24(uStack_1a0._6_2_,CONCAT22(uStack_80._4_2_,uStack_1a0._4_2_)))
            ;
            local_5d8 = local_978._0_8_;
            paStack_5d0 = stack0xfffffffffffff690;
            local_5e8._4_4_ = (int)((ulong)uVar9 >> 0x20);
            uStack_5e0._4_4_ = (int)((ulong)uVar10 >> 0x20);
            auVar52._0_4_ = local_978._0_4_ + CONCAT22((undefined2)uStack_80,sVar64);
            auVar52._4_4_ = local_558._4_4_ + local_568._4_4_ + local_5e8._4_4_;
            auVar52._8_4_ = (int)uStack_550 + CONCAT22(uStack_80._4_2_,uStack_1a0._4_2_);
            auVar52._12_4_ = uStack_550._4_4_ + uStack_560._4_4_ + uStack_5e0._4_4_;
            local_980 = local_980 + 4;
            in_stack_fffffffffffff2d0 = stack0xfffffffffffff690;
            _local_978 = auVar52;
            local_5e8 = uVar9;
            uStack_5e0 = uVar10;
            local_5c8 = uVar11;
            uStack_5c0 = uVar12;
            local_5a8 = uVar13;
            uStack_5a0 = uVar14;
            local_588 = uVar15;
            uStack_580 = uVar16;
            local_568 = uVar17;
            uStack_560 = uVar18;
            local_558 = uVar7;
            uStack_550 = uVar8;
            local_548 = uVar19;
            uStack_540 = uVar20;
            local_538 = uVar5;
            uStack_530 = uVar6;
            local_528 = uVar21;
            uStack_520 = uVar22;
            local_518 = uVar3;
            uStack_510 = uVar4;
            local_508 = uVar23;
            uStack_500 = uVar24;
            local_4f8 = uVar1;
            uStack_4f0 = uVar2;
            local_438 = local_3c8;
            uStack_430 = lStack_3c0;
            local_418 = local_3a8;
            uStack_410 = lStack_3a0;
            local_3f8 = local_388;
            local_368 = local_3c8;
            lStack_360 = lStack_3c0;
            local_348 = local_3a8;
            lStack_340 = lStack_3a0;
            local_238 = local_388;
            local_218 = uVar25;
            uStack_210 = uVar28;
            local_1f8 = uVar31;
            uStack_1f0 = uVar32;
            local_1e8 = local_208;
            local_1d8 = uVar33;
            uStack_1d0 = uVar34;
            local_1c8 = local_208;
            local_1b8 = uVar35;
            uStack_1b0 = uVar36;
            local_1a8 = local_208;
            uStack_1a0 = uStack_a30;
            local_178 = local_208;
            local_158 = local_208;
            local_138 = local_208;
            local_118 = local_208;
            local_108 = local_c38;
            local_e8 = local_c28;
            local_c8 = local_c18;
            local_a8 = local_c08;
            uStack_80 = uStack_c30;
            uStack_60 = uStack_c20;
            uStack_40 = uStack_c10;
            uStack_20 = uStack_c00;
          }
          local_838 = &local_a18;
          local_664 = 0x10;
          local_7b4 = local_9cc;
          local_7b5 = 1;
          local_a18 = 0;
          local_a08 = 0;
          local_a00 = 0;
          local_9f0 = 0;
          local_9ec = 0;
          local_9e8 = 0;
          local_9e4 = 0;
          local_9e0 = 0;
          local_9d8 = 0;
          local_a10 = 0;
          local_810 = local_838;
          local_9f8 = local_6e8;
        }
        uVar1 = local_948;
        uStack_300 = uStack_940;
        uStack_310 = uStack_950;
        local_308._0_4_ = (undefined4)local_948;
        local_308._4_4_ = (undefined4)((ulong)local_948 >> 0x20);
        local_318._0_4_ = (int)local_958;
        local_318._4_4_ = (int)((ulong)local_958 >> 0x20);
        uVar2 = local_968;
        uStack_320 = uStack_960;
        uStack_330 = stack0xfffffffffffff690;
        local_328._0_4_ = (int)local_968;
        local_328._4_4_ = (undefined4)((ulong)local_968 >> 0x20);
        local_338._0_4_ = local_978._0_4_;
        local_338._4_4_ = local_978._4_4_;
        local_2c8 = local_948;
        uVar3 = uStack_940;
        local_2d8 = local_958;
        uVar4 = uStack_950;
        uStack_2c0._0_4_ = (undefined4)uStack_940;
        uStack_2c0._4_4_ = (undefined4)((ulong)uStack_940 >> 0x20);
        uStack_2d0._0_4_ = (undefined4)uStack_950;
        uStack_2d0._4_4_ = (int)((ulong)uStack_950 >> 0x20);
        local_2e8 = local_968;
        uVar5 = uStack_960;
        local_2f8 = local_978._0_8_;
        uVar6 = stack0xfffffffffffff690;
        uStack_2e0._0_4_ = (int)uStack_960;
        uStack_2e0._4_4_ = (undefined4)((ulong)uStack_960 >> 0x20);
        uStack_2f0._0_4_ = local_978._8_4_;
        uStack_2f0._4_4_ = local_978._12_4_;
        local_288 = CONCAT44((int)local_318,(undefined4)local_308);
        uStack_280 = CONCAT44(local_318._4_4_,local_308._4_4_);
        uStack_5f0 = CONCAT44((int)local_338,(int)local_328);
        uStack_290 = CONCAT44(local_338._4_4_,local_328._4_4_);
        iStack_23c = local_318._4_4_;
        iStack_24c = local_338._4_4_;
        local_238 = CONCAT44(local_238._4_4_,(undefined4)local_b38);
        _local_248 = CONCAT44((int)local_318,(undefined4)local_308);
        uStack_950 = CONCAT44(local_318._4_4_,iStack_240);
        local_948 = CONCAT44(local_338._4_4_,iStack_250);
        local_2a8 = CONCAT44((undefined4)uStack_2d0,(undefined4)uStack_2c0);
        uStack_2a0 = CONCAT44(uStack_2d0._4_4_,uStack_2c0._4_4_);
        uStack_610 = CONCAT44((int)uStack_2f0,(int)uStack_2e0);
        uStack_2b0 = CONCAT44(uStack_2f0._4_4_,uStack_2e0._4_4_);
        iStack_25c = uStack_2d0._4_4_;
        local_278 = CONCAT44((int)uStack_2f0,(int)uStack_2e0);
        iStack_26c = uStack_2f0._4_4_;
        _local_258 = CONCAT44((int)local_338,(int)local_328);
        _local_268 = CONCAT44((undefined4)uStack_2d0,(undefined4)uStack_2c0);
        local_978._8_4_ = iStack_260;
        iStack_96c = uStack_2d0._4_4_;
        local_968 = CONCAT44(uStack_2f0._4_4_,iStack_270);
        local_5f8 = local_948;
        local_608 = local_958;
        uStack_600 = uStack_950;
        local_948 = CONCAT44(local_338._4_4_ + local_318._4_4_,iStack_250 + (int)local_318);
        uStack_940 = CONCAT44((int)local_338 + local_318._4_4_,(int)local_328 + iStack_240);
        local_618 = local_968;
        local_628 = local_978._0_8_;
        uStack_620 = stack0xfffffffffffff690;
        local_968 = CONCAT44(uStack_2f0._4_4_ + local_338._4_4_,iStack_270 + (int)local_338);
        uStack_960 = CONCAT44((int)uStack_2f0 + uStack_2d0._4_4_,(int)uStack_2e0 + iStack_260);
        local_638 = local_948;
        uStack_630 = uStack_940;
        local_648 = local_968;
        uStack_640 = uStack_960;
        local_948 = CONCAT44(local_338._4_4_ + local_318._4_4_ + uStack_2f0._4_4_ + local_338._4_4_,
                             iStack_250 + (int)local_318 + iStack_270 + (int)local_338);
        uStack_940 = CONCAT44((int)local_338 + local_318._4_4_ + (int)uStack_2f0 + uStack_2d0._4_4_,
                              (int)local_328 + iStack_240 + (int)uStack_2e0 + iStack_260);
        local_4b8 = (undefined8 *)(local_8e0 + (long)(local_930 << 2) * 4);
        local_4c8 = local_948;
        uStack_4c0 = uStack_940;
        *local_4b8 = local_948;
        local_4b8[1] = uStack_940;
        local_800 = local_840;
        local_338 = local_978._0_8_;
        local_328 = uVar2;
        local_318 = local_958;
        local_308 = uVar1;
        uStack_2f0 = uVar6;
        uStack_2e0 = uVar5;
        uStack_2d0 = uVar4;
        uStack_2c0 = uVar3;
        local_2b8 = uStack_610;
        local_298 = uStack_5f0;
        local_9a8 = local_720;
      }
      local_8e0 = local_8e0 + (long)(local_878 << 2) * 4;
    }
    local_7f0 = local_848;
    local_908 = local_6b0;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff2d0);
  return;
}

Assistant:

static void convolution_pack8to4_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_int8, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m128i _sum0 = _mm_setzero_si128();
                __m128i _sum1 = _mm_setzero_si128();
                __m128i _sum2 = _mm_setzero_si128();
                __m128i _sum3 = _mm_setzero_si128();

                const signed char* kptr = weight_data_int8.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w * 8;

                    for (int k = 0; k < maxk; k++)
                    {
                        // TODO use _mm_cvtepi8_epi16 on sse4.1
                        __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                        _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                        // TODO use _mm_cvtepi8_epi16 on sse4.1
                        __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr);
                        __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr + 16));
                        __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                        __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                        __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                        __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                        __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                        __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

                        __m128i _sl0 = _mm_mullo_epi16(_val, _w0);
                        __m128i _sh0 = _mm_mulhi_epi16(_val, _w0);
                        __m128i _sl1 = _mm_mullo_epi16(_val, _w1);
                        __m128i _sh1 = _mm_mulhi_epi16(_val, _w1);
                        __m128i _sl2 = _mm_mullo_epi16(_val, _w2);
                        __m128i _sh2 = _mm_mulhi_epi16(_val, _w2);
                        __m128i _sl3 = _mm_mullo_epi16(_val, _w3);
                        __m128i _sh3 = _mm_mulhi_epi16(_val, _w3);

                        _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl0, _sh0));
                        _sum1 = _mm_add_epi32(_sum1, _mm_unpacklo_epi16(_sl1, _sh1));
                        _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl2, _sh2));
                        _sum3 = _mm_add_epi32(_sum3, _mm_unpacklo_epi16(_sl3, _sh3));
                        _sum0 = _mm_add_epi32(_sum0, _mm_unpackhi_epi16(_sl0, _sh0));
                        _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl1, _sh1));
                        _sum2 = _mm_add_epi32(_sum2, _mm_unpackhi_epi16(_sl2, _sh2));
                        _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl3, _sh3));

                        kptr += 32;
                    }
                }

                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                    _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                    _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                    _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                    _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum0 = _mm_add_epi32(_sum0, _sum1);
                _sum2 = _mm_add_epi32(_sum2, _sum3);

                _sum0 = _mm_add_epi32(_sum0, _sum2);

                _mm_storeu_si128((__m128i*)(outptr + j * 4), _sum0);
            }

            outptr += outw * 4;
        }
    }
}